

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::LoopUnrollerUtilsImpl
          (LoopUnrollerUtilsImpl *this,IRContext *c,Function *function)

{
  Function *function_local;
  IRContext *c_local;
  LoopUnrollerUtilsImpl *this_local;
  
  this->context_ = c;
  this->function_ = function;
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::vector(&this->blocks_to_add_);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            (&this->invalidated_instructions_);
  LoopUnrollState::LoopUnrollState(&this->state_);
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::vector
            (&this->loop_blocks_inorder_);
  this->loop_condition_block_ = (BasicBlock *)0x0;
  this->loop_induction_variable_ = (Instruction *)0x0;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            (&this->loop_phi_instructions_);
  this->number_of_loop_iterations_ = 0;
  this->loop_step_value_ = 0;
  this->loop_init_value_ = 0;
  return;
}

Assistant:

LoopUnrollerUtilsImpl(IRContext* c, Function* function)
      : context_(c),
        function_(*function),
        loop_condition_block_(nullptr),
        loop_induction_variable_(nullptr),
        number_of_loop_iterations_(0),
        loop_step_value_(0),
        loop_init_value_(0) {}